

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::EliminateDeadMembersPass::GetNewMemberIndex
          (EliminateDeadMembersPass *this,uint32_t type_id,uint32_t member_idx)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  _Rb_tree_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  
  uVar1 = (this->used_members_)._M_h._M_bucket_count;
  uVar4 = (ulong)type_id % uVar1;
  p_Var6 = (this->used_members_)._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint32_t *)&p_Var6->_M_nxt[1]._M_nxt != type_id))
  {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var2[1]._M_nxt == type_id)) goto LAB_005aa9ae;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_005aa9ae:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var7->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)(p_Var2 + 3);
    p_Var5 = p_Var3;
    for (p_Var8 = (_Rb_tree_node_base *)p_Var2[4]._M_nxt; p_Var8 != (_Rb_tree_node_base *)0x0;
        p_Var8 = (&p_Var8->_M_left)[bVar9]) {
      bVar9 = p_Var8[1]._M_color < member_idx;
      if (!bVar9) {
        p_Var5 = p_Var8;
      }
    }
    p_Var8 = p_Var3;
    if ((p_Var5 != p_Var3) && (p_Var8 = p_Var5, member_idx < p_Var5[1]._M_color)) {
      p_Var8 = p_Var3;
    }
    if (p_Var8 == p_Var3) {
      member_idx = 0xffffffff;
    }
    else {
      p_Var3 = (_Rb_tree_node_base *)p_Var2[5]._M_nxt;
      member_idx = 0;
      while (p_Var3 != p_Var8) {
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        member_idx = member_idx + 1;
      }
    }
  }
  return member_idx;
}

Assistant:

uint32_t EliminateDeadMembersPass::GetNewMemberIndex(uint32_t type_id,
                                                     uint32_t member_idx) {
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return member_idx;
  }

  auto current_member = live_members->second.find(member_idx);
  if (current_member == live_members->second.end()) {
    return kRemovedMember;
  }

  return static_cast<uint32_t>(
      std::distance(live_members->second.begin(), current_member));
}